

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triadic.h
# Opt level: O0

TriangleInfo * betterWedgeEnumerator(TriangleInfo *__return_storage_ptr__,CGraph *gout)

{
  EdgeIdx EVar1;
  long local_40;
  EdgeIdx k;
  EdgeIdx j;
  VertexIdx i;
  EdgeIdx loc;
  VertexIdx end2;
  VertexIdx end1;
  CGraph *gout_local;
  
  __return_storage_ptr__->total = 0;
  for (j = 0; j < gout->nVertices; j = j + 1) {
    for (k = gout->offsets[j]; local_40 = k, k < gout->offsets[j + 1]; k = k + 1) {
      while (local_40 = local_40 + 1, local_40 < gout->offsets[j + 1]) {
        EVar1 = Escape::CGraph::getEdgeCount(gout,gout->nbors[k],gout->nbors[local_40]);
        if (EVar1 != -1) {
          __return_storage_ptr__->total = EVar1 + __return_storage_ptr__->total;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TriangleInfo betterWedgeEnumerator(CGraph *gout) {
    TriangleInfo ret;   // output
    ret.total = 0;      // initialize outout

    // We do not need per vertex and per edge information. So commenting out those parts.
    // If you need such information, uncomment them.

//    ret.perVertex = new EdgeIdx[gout->nVertices + 1];
//    ret.perEdge = new EdgeIdx[gout->nEdges + 1];
//
//    for (VertexIdx i = 0; i < gout->nVertices; ++i)
//        ret.perVertex[i] = 0;
//
//    for (EdgeIdx j = 0; j < gout->nEdges; ++j)
//        ret.perEdge[j] = 0;

    VertexIdx end1, end2;
    EdgeIdx loc;

    for (VertexIdx i = 0; i < gout->nVertices; ++i) // loop over vertices
        for (EdgeIdx j = gout->offsets[i]; j < gout->offsets[i + 1]; ++j)   // loop over neighbor of i
            for (EdgeIdx k = j + 1; k < gout->offsets[i + 1]; ++k)         // loop over another neighbor of i
            {
                end1 = gout->nbors[j];     // we are now looking at wedge (i, end1, end2), centered at i
                end2 = gout->nbors[k];

                // note that end1 < end2 because of the labeled ordering

                //loc = gout->getEdgeBinary(end1, end2);
                loc = gout->getEdgeCount(end1, end2);
                if (loc != -1)        // (end1, end2) is present
                {
                    //ret.total++;       // found a triangle! So update total.
                    ret.total += loc;
//                    ret.perVertex[i]++; // update all per vertex counts
//                    ret.perVertex[end1]++;
//                    ret.perVertex[end2]++;
//
//                    ret.perEdge[j]++;  // update all per edge counts. Note that location used is same as position in g->nbors
//                    ret.perEdge[k]++;
//                    ret.perEdge[loc]++;
                }
            }

    return ret;
}